

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aflatin.c
# Opt level: O1

FT_Error af_latin_metrics_init(AF_LatinMetrics metrics,FT_Face face)

{
  char *pcVar1;
  ushort uVar2;
  AF_Blue_Stringset AVar3;
  FT_GlyphSlot_conflict pFVar4;
  FT_Vector *pFVar5;
  AF_StyleMetrics_conflict pAVar6;
  long *plVar7;
  AF_Segment_conflict pAVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  AF_StyleClass *ppAVar12;
  FT_Error FVar13;
  AF_Blue_String AVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  void *pvVar18;
  char *pcVar19;
  FT_ULong FVar20;
  AF_GlyphHintsRec_ *pAVar21;
  AF_Segment_conflict pAVar22;
  AF_StyleMetrics_conflict pAVar23;
  AF_GlyphHintsRec_ *pAVar24;
  FT_Memory pFVar25;
  AF_LatinBlueRec *pAVar26;
  AF_Segment_conflict pAVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  ulong uVar31;
  FT_Bool FVar32;
  FT_Bool FVar33;
  uint uVar34;
  long lVar35;
  FT_Pos *pFVar36;
  FT_CharMap charmap;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  bool bVar40;
  ushort uVar41;
  long lVar42;
  undefined1 *puVar43;
  ulong uVar44;
  ulong uVar45;
  long lVar46;
  uint uVar47;
  int iVar48;
  long *plVar49;
  uint uVar50;
  long *plVar51;
  long *plVar52;
  undefined1 *puVar53;
  FT_UInt FVar54;
  AF_StyleMetrics_conflict pAVar55;
  long lVar56;
  undefined1 *puVar57;
  bool bVar58;
  bool bVar59;
  bool bVar60;
  uint num_idx_1;
  FT_Long y_offset;
  AF_GlyphHintsRec hints [1];
  AF_LatinMetricsRec dummy [1];
  uint local_c3d8;
  FT_Memory local_c3d0;
  uint local_c3c8;
  uint local_c3b0;
  AF_Blue_StringRec *local_c380;
  uint local_c344;
  FT_Vector *local_c340;
  uint local_c338;
  undefined4 uStack_c334;
  long local_c330 [10];
  FT_CharMap local_c2e0;
  AF_LatinBlueRec *local_c2d8;
  ulong local_c2d0;
  char *local_c2c8;
  long local_c2c0;
  ulong local_c2b8;
  ulong local_c2b0;
  AF_StyleMetrics_conflict local_c2a8;
  long local_c2a0;
  AF_GlyphHintsRec_ local_c298;
  AF_GlyphHintsRec_ local_9018 [2];
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar13 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar13 == 0) {
    pFVar25 = face->memory;
    FVar20 = 0;
    local_c2e0 = charmap;
    memset(&local_c298,0,0x1438);
    metrics->axis[0].width_count = 0;
    metrics->axis[1].width_count = 0;
    pcVar19 = af_script_classes[((metrics->root).style_class)->script]->standard_charstring;
    local_c298.memory = pFVar25;
    pvVar18 = (void *)hb_buffer_create();
    do {
      if (*pcVar19 == '\0') break;
      pAVar55 = (AF_StyleMetrics_conflict)(pcVar19 + -1);
      do {
        ppAVar12 = &pAVar55->style_class;
        pAVar55 = (AF_StyleMetrics_conflict)((long)&pAVar55->style_class + 1);
      } while (*(char *)((long)ppAVar12 + 1) == ' ');
      pcVar19 = af_shaper_get_cluster((char *)pAVar55,&metrics->root,pvVar18,(uint *)local_9018);
      if ((uint)local_9018[0].memory < 2) {
        FVar20 = af_shaper_get_elem(pAVar55,pvVar18,0,(FT_Long *)0x0,(FT_Long *)0x0);
        bVar60 = FVar20 != 0;
      }
      else {
        bVar60 = false;
      }
    } while (!bVar60);
    hb_buffer_destroy(pvVar18);
    if (((FVar20 != 0) && (FVar13 = FT_Load_Glyph(face,(FT_UInt)FVar20,1), FVar13 == 0)) &&
       (pFVar4 = face->glyph, 0 < (pFVar4->outline).n_points)) {
      memset(local_9018,0,0x8fe0);
      local_9018[0].axis[0].num_segments = metrics->units_per_em;
      local_9018[0].x_delta = 0x10000;
      local_9018[0].y_scale = 0x10000;
      local_9018[0].y_delta = 0;
      local_9018[0].max_points = 0;
      local_9018[0].num_points = 0;
      local_9018[0].points = (AF_Point_conflict)0x0;
      local_c298.scaler_flags = 0;
      local_c298.metrics = (AF_StyleMetrics_conflict)local_9018;
      local_9018[0].x_scale = (FT_Fixed)face;
      FVar13 = af_glyph_hints_reload(&local_c298,&pFVar4->outline);
      if (FVar13 == 0) {
        lVar42 = 0;
        do {
          local_c338 = 0;
          FVar13 = af_latin_hints_compute_segments(&local_c298,(AF_Dimension)lVar42);
          if (FVar13 != 0) break;
          FVar54 = 0;
          af_latin_hints_link_segments(&local_c298,0,(AF_WidthRec *)0x0,(AF_Dimension)lVar42);
          lVar46 = (long)local_c298.axis[lVar42].num_segments;
          if (0 < lVar46) {
            pAVar22 = local_c298.axis[lVar42].segments;
            pAVar27 = pAVar22 + lVar46;
            uVar31 = 0;
            do {
              pAVar8 = pAVar22->link;
              uVar44 = uVar31;
              if ((pAVar8 != (AF_Segment_conflict)0x0) &&
                 (((uint)uVar31 < 0x10 && pAVar22 < pAVar8) && pAVar22 == pAVar8->link)) {
                iVar48 = (int)pAVar22->pos - (int)pAVar8->pos;
                uVar2 = (ushort)iVar48;
                uVar41 = -uVar2;
                if (0 < iVar48) {
                  uVar41 = uVar2;
                }
                uVar44 = (ulong)((uint)uVar31 + 1);
                metrics->axis[lVar42].widths[uVar31].org = (ulong)uVar41;
              }
              FVar54 = (FT_UInt)uVar44;
              pAVar22 = pAVar22 + 1;
              uVar31 = uVar44;
            } while (pAVar22 < pAVar27);
          }
          local_c338 = FVar54;
          af_sort_and_quantize_widths
                    (&local_c338,metrics->axis[lVar42].widths,
                     (ulong)(uint)local_9018[0].axis[0].num_segments / 100);
          metrics->axis[lVar42].width_count = local_c338;
          bVar60 = lVar42 == 0;
          lVar42 = lVar42 + 1;
        } while (bVar60);
      }
    }
    lVar42 = 0x1f8;
    do {
      if (*(int *)((long)metrics + lVar42 + -0x198) == 0) {
        uVar31 = (ulong)metrics->units_per_em * 0x32 >> 0xb;
      }
      else {
        uVar31 = *(ulong *)((long)metrics + lVar42 + -400);
      }
      *(long *)((long)(metrics->axis[0].widths + -5) + lVar42) = (long)uVar31 / 5;
      *(ulong *)((long)metrics->axis[0].widths + lVar42 + -0x70) = uVar31;
      *(undefined1 *)((long)metrics->axis[0].widths + lVar42 + -0x68) = 0;
      lVar42 = lVar42 + 0x47c8;
    } while (lVar42 == 0x49c0);
    af_glyph_hints_done(&local_c298);
    AVar3 = ((metrics->root).style_class)->blue_stringset;
    uVar16 = metrics->units_per_em;
    pvVar18 = (void *)hb_buffer_create();
    AVar14 = af_blue_stringsets[AVar3].string;
    if (AVar14 != AF_BLUE_STRING_MAX) {
      local_c380 = af_blue_stringsets + AVar3;
      local_c2d0 = (ulong)(uVar16 >> 1) / 7;
      local_c2d8 = metrics->axis[1].blues;
      do {
        if (af_blue_strings[AVar14] == '\0') {
          puVar57 = (undefined1 *)0x0;
          puVar53 = (undefined1 *)0x0;
          uVar16 = 0;
          uVar30 = 0;
        }
        else {
          uVar30 = 0;
          uVar16 = 0;
          puVar53 = (undefined1 *)0x0;
          puVar57 = (undefined1 *)0x0;
          pcVar19 = af_blue_strings + AVar14;
          do {
            pcVar19 = pcVar19 + -1;
            do {
              pcVar1 = pcVar19 + 1;
              pcVar19 = pcVar19 + 1;
            } while (*pcVar1 == ' ');
            local_c2c8 = af_shaper_get_cluster(pcVar19,&metrics->root,pvVar18,&local_c344);
            uVar17 = local_c344;
            if (local_c344 != 0) {
              uVar2 = local_c380->properties;
              pAVar55 = (AF_StyleMetrics_conflict)&DAT_ffffffff80000000;
              if ((uVar2 & 1) == 0) {
                pAVar55 = (AF_StyleMetrics_conflict)&DAT_7fffffff;
              }
              uVar29 = 0;
              bVar60 = false;
              do {
                FVar20 = af_shaper_get_elem(pAVar55,pvVar18,uVar29,(FT_Long *)0x0,
                                            (FT_Long *)&local_c338);
                if (((FVar20 != 0) && (FVar13 = FT_Load_Glyph(face,(FT_UInt)FVar20,1), FVar13 == 0))
                   && (pFVar4 = face->glyph, 2 < (pFVar4->outline).n_points)) {
                  pFVar5 = (pFVar4->outline).points;
                  lVar42 = (long)(pFVar4->outline).n_contours;
                  if (lVar42 < 1) {
                    pAVar23 = (AF_StyleMetrics_conflict)0x0;
                    uVar47 = 0xffffffff;
                    uVar11 = 0;
                    local_c3d8 = 0;
                  }
                  else {
                    lVar46 = CONCAT44(uStack_c334,local_c338);
                    lVar56 = 0;
                    uVar47 = 0xffffffff;
                    local_c3d8 = 0;
                    uVar11 = 0;
                    uVar38 = 0;
                    pAVar23 = (AF_StyleMetrics_conflict)0x0;
                    do {
                      uVar37 = (uint)(pFVar4->outline).contours[lVar56];
                      if ((int)uVar38 < (int)uVar37) {
                        lVar35 = (long)(int)uVar38;
                        uVar15 = uVar47;
                        if ((uVar2 & 3) == 0) {
                          pFVar36 = &pFVar5[lVar35].y;
                          lVar35 = ((int)uVar37 - lVar35) + 1;
                          uVar28 = uVar38;
                          do {
                            if (((int)uVar15 < 0) || (*pFVar36 < (long)pAVar23)) {
                              pAVar23 = (AF_StyleMetrics_conflict)*pFVar36;
                              puVar43 = (undefined1 *)((long)&pAVar23->style_class + lVar46);
                              uVar15 = uVar28;
                              if ((long)puVar43 <= (long)puVar57) {
                                puVar57 = puVar43;
                              }
                            }
                            else {
                              puVar43 = (undefined1 *)(*pFVar36 + lVar46);
                              if ((long)puVar53 <= (long)puVar43) {
                                puVar53 = puVar43;
                              }
                            }
                            uVar28 = uVar28 + 1;
                            pFVar36 = pFVar36 + 2;
                            lVar35 = lVar35 + -1;
                          } while (lVar35 != 0);
                        }
                        else {
                          pFVar36 = &pFVar5[lVar35].y;
                          lVar35 = ((int)uVar37 - lVar35) + 1;
                          uVar28 = uVar38;
                          do {
                            if (((int)uVar15 < 0) || ((long)pAVar23 < *pFVar36)) {
                              pAVar23 = (AF_StyleMetrics_conflict)*pFVar36;
                              puVar43 = (undefined1 *)((long)&pAVar23->style_class + lVar46);
                              uVar15 = uVar28;
                              if ((long)puVar53 <= (long)puVar43) {
                                puVar53 = puVar43;
                              }
                            }
                            else {
                              puVar43 = (undefined1 *)(*pFVar36 + lVar46);
                              if ((long)puVar43 <= (long)puVar57) {
                                puVar57 = puVar43;
                              }
                            }
                            uVar28 = uVar28 + 1;
                            pFVar36 = pFVar36 + 2;
                            lVar35 = lVar35 + -1;
                          } while (lVar35 != 0);
                        }
                        bVar58 = uVar15 != uVar47;
                        uVar47 = uVar15;
                        if (bVar58) {
                          local_c3d8 = uVar38;
                          uVar11 = uVar37;
                        }
                      }
                      uVar38 = uVar37 + 1;
                      lVar56 = lVar56 + 1;
                    } while (lVar56 != lVar42);
                  }
                  if ((int)uVar47 < 0) {
                    bVar58 = false;
                  }
                  else {
                    pcVar19 = (pFVar4->outline).tags;
                    lVar42 = pFVar5[uVar47].x;
                    uVar37 = 0xffffffff;
                    uVar38 = 0xffffffff;
                    uVar15 = uVar47;
                    if ((pcVar19[uVar47] & 3U) == 1) {
                      uVar37 = uVar47;
                      uVar38 = uVar47;
                    }
                    do {
                      uVar28 = uVar15 - 1;
                      if ((int)uVar15 <= (int)local_c3d8) {
                        uVar28 = uVar11;
                      }
                      uVar44 = pFVar5[(int)uVar28].y - (long)pAVar23;
                      uVar31 = -uVar44;
                      if (0 < (long)uVar44) {
                        uVar31 = uVar44;
                      }
                      uVar39 = uVar47;
                      if (5 < uVar31) {
                        uVar45 = pFVar5[(int)uVar28].x - lVar42;
                        uVar44 = -uVar45;
                        if (0 < (long)uVar45) {
                          uVar44 = uVar45;
                        }
                        if (uVar44 <= uVar31 * 0x14) break;
                      }
                      uVar15 = uVar37;
                      if ((int)uVar37 < 0) {
                        uVar15 = uVar28;
                      }
                      if ((pcVar19[(int)uVar28] & 3U) == 1) {
                        uVar38 = uVar28;
                        uVar37 = uVar15;
                      }
                      uVar15 = uVar28;
                    } while (uVar28 != uVar47);
                    do {
                      uVar28 = uVar39 + 1;
                      if ((int)uVar11 <= (int)uVar39) {
                        uVar28 = local_c3d8;
                      }
                      uVar44 = pFVar5[(int)uVar28].y - (long)pAVar23;
                      uVar31 = -uVar44;
                      if (0 < (long)uVar44) {
                        uVar31 = uVar44;
                      }
                      if (5 < uVar31) {
                        uVar45 = pFVar5[(int)uVar28].x - lVar42;
                        uVar44 = -uVar45;
                        if (0 < (long)uVar45) {
                          uVar44 = uVar45;
                        }
                        if (uVar44 <= uVar31 * 0x14) break;
                      }
                      uVar39 = uVar38;
                      if ((int)uVar38 < 0) {
                        uVar39 = uVar28;
                      }
                      if ((pcVar19[(int)uVar28] & 3U) == 1) {
                        uVar37 = uVar28;
                        uVar38 = uVar39;
                      }
                      uVar39 = uVar28;
                    } while (uVar28 != uVar47);
                    if ((uVar2 & 0x10) == 0) {
LAB_0017f1a2:
                      if (((int)uVar38 < 0) || ((int)uVar37 < 0)) {
LAB_0017f1df:
                        bVar58 = true;
                        if ((pcVar19[(int)uVar15] & 3U) == 1) {
                          bVar58 = (pcVar19[(int)uVar39] & 3U) != 1;
                        }
                      }
                      else {
                        uVar44 = pFVar5[uVar37].x - pFVar5[uVar38].x;
                        uVar31 = -uVar44;
                        if (0 < (long)uVar44) {
                          uVar31 = uVar44;
                        }
                        if (uVar31 <= local_c2d0) goto LAB_0017f1df;
                        bVar58 = false;
                      }
                      pAVar23 = (AF_StyleMetrics_conflict)
                                ((long)&pAVar23->style_class + CONCAT44(uStack_c334,local_c338));
                      bVar40 = !bVar58 || (uVar2 & 4) == 0;
                    }
                    else {
                      local_c2b8 = (ulong)metrics->units_per_em / 0x19;
                      uVar44 = pFVar5[(int)uVar39].x - pFVar5[(int)uVar15].x;
                      uVar31 = -uVar44;
                      if (0 < (long)uVar44) {
                        uVar31 = uVar44;
                      }
                      bVar59 = true;
                      if ((uVar31 < local_c2b8) &&
                         (uVar34 = uVar47,
                         (int)((uVar39 - uVar15) + 2) <= (int)(uVar11 - local_c3d8))) {
                        do {
                          uVar9 = uVar34 - 1;
                          if ((int)uVar34 <= (int)local_c3d8) {
                            uVar9 = uVar11;
                          }
                          lVar46 = pFVar5[(int)uVar9].x;
                        } while ((lVar46 == lVar42) && (uVar34 = uVar9, uVar9 != uVar47));
                        if (uVar9 != uVar47) {
                          local_c2c0 = lVar46;
                          bVar58 = false;
                          uVar50 = 0;
                          local_c3c8 = 0;
                          local_c3b0 = uVar39;
                          uVar34 = uVar39;
                          do {
                            if ((!bVar58) &&
                               (uVar50 = 0xffffffff, local_c3c8 = 0xffffffff, local_c3b0 = uVar34,
                               (pcVar19[(int)uVar34] & 3U) == 1)) {
                              uVar50 = uVar34;
                              local_c3c8 = uVar34;
                            }
                            bVar58 = (int)uVar11 <= (int)uVar34;
                            uVar34 = uVar34 + 1;
                            if (bVar58) {
                              uVar34 = local_c3d8;
                            }
                            pAVar6 = (AF_StyleMetrics_conflict)pFVar5[(int)local_c3b0].y;
                            uVar44 = (long)pAVar23 - (long)pAVar6;
                            uVar31 = -uVar44;
                            if (0 < (long)uVar44) {
                              uVar31 = uVar44;
                            }
                            if (metrics->units_per_em >> 2 < uVar31) {
LAB_0017f302:
                              bVar59 = false;
                              bVar58 = false;
                            }
                            else {
                              local_c2a0 = (long)(int)uVar34;
                              local_c340 = pFVar5 + local_c2a0;
                              local_c2a8 = pAVar6;
                              uVar44 = pFVar5[local_c2a0].y - (long)pAVar6;
                              uVar31 = -uVar44;
                              if (0 < (long)uVar44) {
                                uVar31 = uVar44;
                              }
                              if (5 < uVar31) {
                                uVar45 = local_c340->x - pFVar5[(int)local_c3b0].x;
                                uVar44 = -uVar45;
                                if (0 < (long)uVar45) {
                                  uVar44 = uVar45;
                                }
                                if (uVar44 <= uVar31 * 0x14) goto LAB_0017f302;
                              }
                              local_c2b0 = uVar31;
                              uVar10 = uVar50;
                              if ((int)uVar50 < 0) {
                                uVar10 = uVar34;
                              }
                              if ((pcVar19[local_c2a0] & 3U) == 1) {
                                local_c3c8 = uVar34;
                                uVar50 = uVar10;
                              }
                              lVar56 = pFVar5[(int)local_c3b0].x;
                              uVar45 = local_c340->x - lVar56;
                              uVar44 = -uVar45;
                              if (0 < (long)uVar45) {
                                uVar44 = uVar45;
                              }
                              bVar59 = false;
                              bVar58 = true;
                              if (((uVar45 != 0 && lVar56 <= local_c340->x) == lVar46 < lVar42) &&
                                 (local_c2b8 <= uVar44)) {
                                do {
                                  bVar58 = (int)uVar11 <= (int)uVar34;
                                  uVar34 = uVar34 + 1;
                                  if (bVar58) {
                                    uVar34 = local_c3d8;
                                  }
                                  uVar45 = pFVar5[(int)uVar34].y - (long)pAVar6;
                                  uVar44 = -uVar45;
                                  if (0 < (long)uVar45) {
                                    uVar44 = uVar45;
                                  }
                                  if (5 < uVar44) {
                                    uVar45 = pFVar5[(int)uVar28].x - lVar56;
                                    uVar44 = -uVar45;
                                    if (0 < (long)uVar45) {
                                      uVar44 = uVar45;
                                    }
                                    if (uVar44 <= uVar31 * 0x14) {
                                      bVar58 = (int)uVar34 <= (int)local_c3d8;
                                      uVar34 = uVar34 - 1;
                                      if (bVar58) {
                                        uVar34 = uVar11;
                                      }
                                      bVar59 = true;
                                      bVar58 = true;
                                      pAVar23 = pAVar6;
                                      uVar38 = uVar50;
                                      uVar37 = local_c3c8;
                                      uVar39 = uVar34;
                                      uVar15 = local_c3b0;
                                      goto LAB_0017f309;
                                    }
                                  }
                                  uVar38 = uVar50;
                                  if ((int)uVar50 < 0) {
                                    uVar38 = uVar34;
                                  }
                                  if ((pcVar19[(int)uVar34] & 3U) == 1) {
                                    uVar50 = uVar38;
                                  }
                                  local_c3c8 = uVar34;
                                } while (uVar34 != uVar15);
                                bVar59 = true;
                                bVar58 = true;
                                pAVar23 = local_c2a8;
                                uVar38 = uVar50;
                                uVar37 = uVar34;
                                uVar39 = uVar34;
                                uVar15 = local_c3b0;
                              }
                            }
LAB_0017f309:
                          } while ((!bVar59) && (uVar34 != uVar15));
                        }
                        bVar59 = uVar9 != uVar47;
                      }
                      bVar40 = false;
                      bVar58 = false;
                      if (bVar59) goto LAB_0017f1a2;
                    }
                    if (!bVar40) goto LAB_0017f258;
                  }
                  if ((uVar2 & 1) == 0) {
                    if ((long)pAVar23 < (long)pAVar55) {
                      pAVar55 = pAVar23;
                      bVar60 = bVar58;
                    }
                  }
                  else if ((long)pAVar55 < (long)pAVar23) {
                    pAVar55 = pAVar23;
                    bVar60 = bVar58;
                  }
                }
LAB_0017f258:
                uVar29 = uVar29 + 1;
              } while (uVar29 != uVar17);
              if ((pAVar55 != (AF_StyleMetrics_conflict)&DAT_ffffffff80000000) &&
                 (pAVar55 != (AF_StyleMetrics_conflict)&DAT_7fffffff)) {
                if (bVar60) {
                  pAVar24 = &local_c298;
                  uVar17 = uVar16 + 1;
                  uVar29 = uVar30;
                }
                else {
                  uVar29 = uVar30 + 1;
                  pAVar24 = local_9018;
                  uVar17 = uVar16;
                  uVar16 = uVar30;
                }
                *(AF_StyleMetrics_conflict *)
                 ((long)pAVar24->axis[0].embedded.segments + (ulong)uVar16 * 8 + -0x70) = pAVar55;
                uVar16 = uVar17;
                uVar30 = uVar29;
              }
            }
            pcVar19 = local_c2c8;
          } while (*local_c2c8 != '\0');
        }
        if (uVar30 != 0 || uVar16 != 0) {
          if (1 < uVar16) {
            uVar17 = 1;
            do {
              uVar31 = (ulong)uVar17;
              do {
                lVar42 = *(long *)((long)local_c298.axis[0].embedded.segments + uVar31 * 8 + -0x70);
                uVar44 = (ulong)((int)uVar31 - 1);
                lVar46 = *(long *)((long)local_c298.axis[0].embedded.segments + uVar44 * 8 + -0x70);
                if (lVar46 <= lVar42) break;
                *(long *)((long)local_c298.axis[0].embedded.segments + uVar31 * 8 + -0x70) = lVar46;
                *(long *)((long)local_c298.axis[0].embedded.segments + uVar44 * 8 + -0x70) = lVar42;
                uVar31 = uVar44;
              } while (uVar44 != 0);
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar16);
          }
          if (1 < uVar30) {
            uVar17 = 1;
            do {
              uVar31 = (ulong)uVar17;
              do {
                pFVar25 = (&local_9018[0].memory)[uVar31];
                uVar44 = (ulong)((int)uVar31 - 1);
                if ((long)(&local_9018[0].memory)[uVar44] <= (long)pFVar25) break;
                (&local_9018[0].memory)[uVar31] = (&local_9018[0].memory)[uVar44];
                (&local_9018[0].memory)[uVar44] = pFVar25;
                uVar31 = uVar44;
              } while (uVar44 != 0);
              uVar17 = uVar17 + 1;
            } while (uVar17 != uVar30);
          }
          uVar17 = metrics->axis[1].blue_count;
          pAVar26 = local_c2d8 + uVar17;
          metrics->axis[1].blue_count = uVar17 + 1;
          if (uVar30 == 0) {
            pFVar25 = *(FT_Memory *)
                       ((long)local_c298.axis[0].embedded.segments +
                       (ulong)(uVar16 >> 1) * 8 + -0x70);
LAB_0017f647:
            (pAVar26->shoot).org = (FT_Pos)pFVar25;
            (pAVar26->ref).org = (FT_Pos)pFVar25;
          }
          else {
            pFVar25 = (&local_9018[0].memory)[uVar30 >> 1];
            if (uVar16 == 0) goto LAB_0017f647;
            (pAVar26->ref).org = (FT_Pos)pFVar25;
            (pAVar26->shoot).org =
                 *(FT_Pos *)
                  ((long)local_c298.axis[0].embedded.segments + (ulong)(uVar16 >> 1) * 8 + -0x70);
          }
          lVar42 = (pAVar26->ref).org;
          lVar46 = (pAVar26->shoot).org;
          if ((lVar46 != lVar42) && (lVar46 <= lVar42 == ((local_c380->properties & 3) != 0))) {
            lVar42 = (lVar42 + lVar46) / 2;
            (pAVar26->shoot).org = lVar42;
            (pAVar26->ref).org = lVar42;
          }
          pAVar26->ascender = (FT_Pos)puVar53;
          pAVar26->descender = (FT_Pos)puVar57;
          uVar2 = local_c380->properties;
          pAVar26->flags = (uint)uVar2 + (uint)uVar2 & 0xe;
          if ((uVar2 & 8) != 0) {
            *(byte *)&pAVar26->flags = (byte)pAVar26->flags | 0x10;
          }
        }
        AVar14 = local_c380[1].string;
        local_c380 = local_c380 + 1;
      } while (AVar14 != AF_BLUE_STRING_MAX);
    }
    hb_buffer_destroy(pvVar18);
    uVar16 = metrics->axis[1].blue_count;
    if ((ulong)uVar16 != 0) {
      pAVar26 = metrics->axis[1].blues;
      uVar31 = 0;
      do {
        local_c330[uVar31 - 1] = (long)pAVar26;
        uVar31 = uVar31 + 1;
        pAVar26 = pAVar26 + 1;
      } while (uVar16 != uVar31);
      if (uVar16 != 1) {
        uVar31 = 1;
        do {
          iVar48 = (int)uVar31;
          do {
            uVar30 = (int)uVar31 - 1;
            uVar44 = (ulong)uVar30;
            plVar49 = (long *)local_c330[uVar44 - 1];
            plVar51 = plVar49;
            if ((*(byte *)(plVar49 + 8) & 6) == 0) {
              plVar51 = plVar49 + 3;
            }
            plVar7 = (long *)local_c330[uVar31 - 1];
            plVar52 = plVar7 + 3;
            if ((*(byte *)(plVar7 + 8) & 6) != 0) {
              plVar52 = plVar7;
            }
            if (*plVar51 <= *plVar52) break;
            local_c330[uVar31 - 1] = (long)plVar49;
            local_c330[uVar44 - 1] = (long)plVar7;
            uVar31 = (ulong)uVar30;
          } while (uVar44 != 0);
          uVar30 = iVar48 + 1;
          uVar31 = (ulong)uVar30;
        } while (uVar30 != uVar16);
      }
      if (uVar16 - 1 != 0) {
        uVar31 = 0;
        do {
          lVar42 = local_c330[uVar31 - 1];
          if ((*(byte *)(lVar42 + 0x40) & 6) == 0) {
            lVar46 = 0;
          }
          else {
            lVar46 = 0x18;
          }
          plVar49 = (long *)local_c330[uVar31];
          if ((*(byte *)(plVar49 + 8) & 6) != 0) {
            plVar49 = plVar49 + 3;
          }
          if (*plVar49 < *(long *)(lVar42 + lVar46)) {
            *(long *)(lVar42 + lVar46) = *plVar49;
          }
          uVar31 = uVar31 + 1;
        } while (uVar16 - 1 != uVar31);
      }
    }
    local_c298.memory = (FT_Memory)0x0;
    local_9018[0].memory._0_1_ = '0';
    local_9018[0].memory._1_1_ = ' ';
    local_9018[0].memory._2_1_ = '1';
    local_9018[0].memory._3_1_ = ' ';
    local_9018[0].memory._4_1_ = '2';
    local_9018[0].memory._5_1_ = ' ';
    local_9018[0].memory._6_1_ = '3';
    local_9018[0].memory._7_1_ = ' ';
    local_9018[0].x_scale = 0x2037203620352034;
    local_9018[0].x_delta = CONCAT44(local_9018[0].x_delta._4_4_,0x392038);
    FVar32 = '\x01';
    FVar33 = '\x01';
    pvVar18 = (void *)hb_buffer_create();
    local_c3d0 = (FT_Memory)0x0;
    bVar60 = false;
    pAVar24 = local_9018;
    do {
      if (*(char *)&pAVar24->memory == '\0') break;
      pAVar21 = (AF_GlyphHintsRec_ *)
                af_shaper_get_cluster((char *)pAVar24,&metrics->root,pvVar18,&local_c338);
      if (local_c338 < 2) {
        bVar58 = false;
        FVar20 = af_shaper_get_elem((AF_StyleMetrics_conflict)pAVar24,pvVar18,0,
                                    (FT_Long *)&local_c298,(FT_Long *)0x0);
        if (FVar20 != 0) {
          bVar59 = true;
          if (bVar60) {
            bVar58 = local_c298.memory != local_c3d0;
            FVar33 = FVar32;
            bVar60 = bVar59;
            if (bVar58) {
              FVar33 = '\0';
              FVar32 = FVar33;
            }
          }
          else {
            bVar58 = false;
            local_c3d0 = local_c298.memory;
            bVar60 = bVar59;
          }
        }
      }
      else {
        bVar58 = false;
      }
      pAVar24 = pAVar21;
    } while (!bVar58);
    hb_buffer_destroy(pvVar18);
    (metrics->root).digits_have_same_width = FVar33;
    charmap = local_c2e0;
  }
  FT_Set_Charmap(face,charmap);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_latin_metrics_init( AF_LatinMetrics  metrics,
                         FT_Face          face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_latin_metrics_init_widths( metrics, face );
      af_latin_metrics_init_blues( metrics, face );
      af_latin_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );
    return FT_Err_Ok;
  }